

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

int Scl_LibertyReadTimingSense(Scl_Tree_t *p,Scl_Item_t *pPin)

{
  int iVar1;
  Scl_Item_t *pSVar2;
  char *__s1;
  int *piVar3;
  
  piVar3 = &pPin->Child;
  while( true ) {
    pSVar2 = Scl_LibertyItem(p,*piVar3);
    if (pSVar2 == (Scl_Item_t *)0x0) {
      return 3;
    }
    iVar1 = Scl_LibertyCompare(p,pSVar2->Key,"timing_sense");
    if (iVar1 == 0) break;
    piVar3 = &pSVar2->Next;
  }
  __s1 = Scl_LibertyReadString(p,pSVar2->Head);
  iVar1 = strcmp(__s1,"positive_unate");
  if (iVar1 != 0) {
    iVar1 = strcmp(__s1,"negative_unate");
    return 3 - (uint)(iVar1 == 0);
  }
  return 1;
}

Assistant:

int Scl_LibertyReadTimingSense( Scl_Tree_t * p, Scl_Item_t * pPin )
{
    Scl_Item_t * pItem;
    Scl_ItemForEachChildName( p, pPin, pItem, "timing_sense" )
    {
        char * pToken = Scl_LibertyReadString(p, pItem->Head);
        if ( !strcmp(pToken, "positive_unate") )
            return sc_ts_Pos;
        if ( !strcmp(pToken, "negative_unate") )
            return sc_ts_Neg;
        if ( !strcmp(pToken, "non_unate") )
            return sc_ts_Non;
        break;
    }
    return sc_ts_Non;
}